

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void __thiscall
Style::Style::parseDatamodel
          (Style *this,xml_node<char> *datamodel,
          vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>
          *tempConstraints,
          vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
          *universalFields,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
          *entryFields,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
          *fields)

{
  int iVar1;
  char *pcVar2;
  logic_error *this_00;
  ostream *poVar3;
  char *name;
  xml_node<char> *node;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
  *fields_local;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
  *entryFields_local;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  *universalFields_local;
  vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>
  *tempConstraints_local;
  xml_node<char> *datamodel_local;
  Style *this_local;
  
  pcVar2 = rapidxml::xml_base<char>::name(&datamodel->super_xml_base<char>);
  iVar1 = strcmp(pcVar2,"bcf:datamodel");
  if (iVar1 == 0) {
    for (name = (char *)rapidxml::xml_node<char>::first_node(datamodel,(char *)0x0,0,true);
        name != (char *)0x0;
        name = (char *)rapidxml::xml_node<char>::next_sibling
                                 ((xml_node<char> *)name,(char *)0x0,0,true)) {
      pcVar2 = rapidxml::xml_base<char>::name((xml_base<char> *)name);
      iVar1 = strcmp(pcVar2 + 4,"constants");
      if (iVar1 == 0) {
        parseConstants(this,(xml_node<char> *)name);
      }
      else {
        iVar1 = strcmp(pcVar2 + 4,"entrytypes");
        if (iVar1 == 0) {
          parseEntryTypes(this,(xml_node<char> *)name);
        }
        else {
          iVar1 = strcmp(pcVar2 + 4,"fields");
          if (iVar1 == 0) {
            parseFields(this,(xml_node<char> *)name,fields);
          }
          else {
            iVar1 = strcmp(pcVar2 + 4,"entryfields");
            if (iVar1 == 0) {
              parseEntryFields(this,(xml_node<char> *)name,universalFields,entryFields);
            }
            else {
              iVar1 = strcmp(pcVar2 + 4,"constraints");
              if (iVar1 == 0) {
                parseConstraints(this,(xml_node<char> *)name,tempConstraints);
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,"Unhandled datamodel entry ");
                poVar3 = std::operator<<(poVar3,pcVar2);
                std::operator<<(poVar3,"\n");
              }
            }
          }
        }
      }
    }
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected node name");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::parseDatamodel (xml_node<> *datamodel, vector<TempConstraintData> &tempConstraints, vector<u16string> &universalFields, unordered_map<u16string, vector<u16string>> &entryFields, unordered_map<u16string, Field> &fields) {
    EXPECT_NAME(datamodel, "bcf:datamodel");

    for (xml_node<> *node = datamodel->first_node(); node; node = node->next_sibling()) {
        const char *name = node->name();

        if (IS("constants")) {
            parseConstants(node);
        } else if (IS("entrytypes")) {
            parseEntryTypes(node);
        } else if (IS("fields")) {
            parseFields(node, fields);
        } else if (IS("entryfields")) {
            parseEntryFields(node, universalFields, entryFields);
        } else if (IS("constraints")) {
            parseConstraints(node, tempConstraints);
        } else {
            std::cerr << "Unhandled datamodel entry " << name << "\n";
        }
    }
}